

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshvolume.cpp
# Opt level: O2

float computeMeshVolume2(float *vertices,uint tcount,uint *indices)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  
  fVar2 = 0.0;
  while (bVar1 = tcount != 0, tcount = tcount - 1, bVar1) {
    fVar3 = tetVolume(vertices,vertices + *indices * 3,vertices + indices[1] * 3,
                      vertices + indices[2] * 3);
    indices = indices + 3;
    fVar2 = fVar2 + fVar3;
  }
  return fVar2 * 0.16666667;
}

Assistant:

float computeMeshVolume2(const float *vertices,unsigned int tcount,const unsigned int *indices)
{
	float volume = 0;

	const float *p0 = vertices;
	for (unsigned int i=0; i<tcount; i++,indices+=3)
	{

		const float *p1 = &vertices[ indices[0]*3 ];
		const float *p2 = &vertices[ indices[1]*3 ];
		const float *p3 = &vertices[ indices[2]*3 ];

		volume+=tetVolume(p0,p1,p2,p3); // compute the volume of the tetrahedron relative to the root vertice
	}

  return volume * (1.0f / 6.0f );
}